

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O2

bool __thiscall
QMimeDatabasePrivate::mimeInherits(QMimeDatabasePrivate *this,QString *mime,QString *parent)

{
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._0_8_ = &this->mutex;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
  local_30[8] = true;
  bVar1 = inherits(this,mime,parent);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeDatabasePrivate::mimeInherits(const QString &mime, const QString &parent)
{
    QMutexLocker locker(&mutex);
    return inherits(mime, parent);
}